

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

_Bool chck_buffer(chck_buffer *buf,size_t size,chck_endianess endianess)

{
  void *ptr;
  
  if (buf == (chck_buffer *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                  ,0x6b,"_Bool chck_buffer(struct chck_buffer *, size_t, enum chck_endianess)");
  }
  if (size == 0) {
    ptr = (void *)0x0;
  }
  else {
    ptr = malloc(size);
    if (ptr == (void *)0x0) {
      return false;
    }
  }
  chck_buffer_from_pointer(buf,ptr,size,endianess);
  buf->copied = true;
  return true;
}

Assistant:

bool
chck_buffer(struct chck_buffer *buf, size_t size, enum chck_endianess endianess)
{
   assert(buf);

   void *data = NULL;
   if (size > 0 && !(data = malloc(size)))
      return false;

   if (unlikely(!chck_buffer_from_pointer(buf, data, size, endianess)))
      goto fail;

   buf->copied = true;
   return true;

fail:
   free(data);
   return false;
}